

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O2

BayesianGameIdenticalPayoff *
BayesianGameIdenticalPayoff::GenerateRandomBG
          (BayesianGameIdenticalPayoff *__return_storage_ptr__,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *acs,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *obs)

{
  int iVar1;
  size_t sVar2;
  Index jtype;
  ulong uVar3;
  Index ja;
  uint i;
  ulong uVar4;
  double r;
  vector<double,_std::allocator<double>_> typeProbs;
  double local_48;
  double local_40;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  uVar3 = 0;
  BayesianGameIdenticalPayoff(__return_storage_ptr__,nrAgents,acs,obs,false);
  while( true ) {
    sVar2 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
    if (sVar2 <= uVar3) break;
    uVar4 = 0;
    while( true ) {
      sVar2 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)__return_storage_ptr__);
      if (sVar2 <= uVar4) break;
      rand();
      (*(__return_storage_ptr__->_m_utilFunction->super_QTableInterface)._vptr_QTableInterface[1])
                (__return_storage_ptr__->_m_utilFunction,uVar3,uVar4);
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  uVar3 = 0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    sVar2 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
    if (sVar2 <= uVar3) break;
    iVar1 = rand();
    local_40 = (double)iVar1 / 2147483647.0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&local_38,&local_40);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  local_48 = 0.0;
  uVar3 = 0;
  while( true ) {
    sVar2 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
    if (sVar2 <= uVar3) break;
    local_48 = local_48 + local_38._M_impl.super__Vector_impl_data._M_start[uVar3];
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  i = 0;
  while( true ) {
    sVar2 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
    if (sVar2 <= i) break;
    BayesianGameBase::SetProbability
              ((BayesianGameBase *)__return_storage_ptr__,i,
               local_38._M_impl.super__Vector_impl_data._M_start[i] / local_48);
    i = i + 1;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

BayesianGameIdenticalPayoff 
BayesianGameIdenticalPayoff::GenerateRandomBG(
            size_t nrAgents,
            std::vector<size_t> acs,
            std::vector<size_t> obs
        )
{
    BayesianGameIdenticalPayoff bgip(nrAgents, acs, obs);
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
        for(Index ja = 0; ja < bgip.GetNrJointActions(); ja++)
        {
            double rn = (rand() - (0.5 * RAND_MAX)) / (RAND_MAX / 20.0);
            bgip.SetUtility(jtype, ja, rn );
        }

    //create random, normalized prob distr.
    vector<double> typeProbs;
    double sum = 0.0;
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
    {
        double r = ((double)rand()) / RAND_MAX;
        typeProbs.push_back(r);
    }
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
        sum += typeProbs[jtype];
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
        bgip.SetProbability(jtype, typeProbs[jtype] / sum );

    //bgip.Print();
    return(bgip);
}